

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampler.cc
# Opt level: O2

int __thiscall
webrtc::Resampler::ResetIfNeeded(Resampler *this,int inFreq,int outFreq,size_t num_channels)

{
  int iVar1;
  
  if (((inFreq / 1000 == this->my_in_frequency_khz_) &&
      (outFreq / 1000 == this->my_out_frequency_khz_)) && (this->num_channels_ == num_channels)) {
    return 0;
  }
  iVar1 = Reset(this,inFreq,outFreq,num_channels);
  return iVar1;
}

Assistant:

int Resampler::ResetIfNeeded(int inFreq, int outFreq, size_t num_channels)
{
    int tmpInFreq_kHz = inFreq / 1000;
    int tmpOutFreq_kHz = outFreq / 1000;

    if ((tmpInFreq_kHz != my_in_frequency_khz_) || (tmpOutFreq_kHz != my_out_frequency_khz_)
            || (num_channels != num_channels_))
    {
        return Reset(inFreq, outFreq, num_channels);
    } else
    {
        return 0;
    }
}